

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> * __thiscall
testing::internal::FunctionMocker<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::With
          (FunctionMocker<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,
          Matcher<int> *m1,Matcher<const_char_*> *m2,Matcher<__locale_struct_*> *m3)

{
  tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
  tStack_58;
  
  std::tr1::
  tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
  ::tuple(&tStack_58,m1,m2,m3);
  std::tr1::
  tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>
  ::CopyFrom<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>>
            ((tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>
              *)&(this->
                 super_FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>).
                 current_spec_.matchers_,&tStack_58);
  std::tr1::
  tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
  ::~tuple(&tStack_58);
  return &(this->super_FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>).
          current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2,
      const Matcher<A3>& m3) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2, m3));
    return this->current_spec();
  }